

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O0

Rectangle * __thiscall
QPDFMatrix::transformRectangle(Rectangle *__return_storage_ptr__,QPDFMatrix *this,Rectangle r)

{
  double llx;
  double lly;
  double urx;
  reference pvVar1;
  reference pvVar2;
  reference pdVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b0;
  double *local_a8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_a0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_98;
  double *local_90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_80;
  double *local_78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  allocator<double> local_59;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> ty;
  allocator<double> local_29;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> tx;
  QPDFMatrix *this_local;
  
  tx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &this->a;
  std::allocator<double>::allocator(&local_29);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,4,&local_29);
  std::allocator<double>::~allocator(&local_29);
  std::allocator<double>::allocator(&local_59);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58,4,&local_59);
  std::allocator<double>::~allocator(&local_59);
  pvVar1 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)local_28,0);
  pvVar2 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)local_58,0);
  transform(this,r.llx,r.lly,pvVar1,pvVar2);
  pvVar1 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)local_28,1);
  pvVar2 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)local_58,1);
  transform(this,r.llx,r.ury,pvVar1,pvVar2);
  pvVar1 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)local_28,2);
  pvVar2 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)local_58,2);
  transform(this,r.urx,r.lly,pvVar1,pvVar2);
  pvVar1 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)local_28,3);
  pvVar2 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)local_58,3);
  transform(this,r.urx,r.ury,pvVar1,pvVar2);
  local_70._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_28);
  local_78 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)local_28);
  local_68 = std::
             min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (local_70,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  )local_78);
  pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_68);
  llx = *pdVar3;
  local_88._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_58);
  local_90 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)local_58);
  local_80 = std::
             min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (local_88,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  )local_90);
  pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_80);
  lly = *pdVar3;
  local_a0._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_28);
  local_a8 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)local_28);
  local_98 = std::
             max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (local_a0,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  )local_a8);
  pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_98);
  urx = *pdVar3;
  __first = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_58);
  __last = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_58);
  local_b0 = std::
             max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (__first._M_current,__last._M_current);
  pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_b0);
  QPDFObjectHandle::Rectangle::Rectangle(__return_storage_ptr__,llx,lly,urx,*pdVar3);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Rectangle
QPDFMatrix::transformRectangle(QPDFObjectHandle::Rectangle r) const
{
    std::vector<double> tx(4);
    std::vector<double> ty(4);
    transform(r.llx, r.lly, tx.at(0), ty.at(0));
    transform(r.llx, r.ury, tx.at(1), ty.at(1));
    transform(r.urx, r.lly, tx.at(2), ty.at(2));
    transform(r.urx, r.ury, tx.at(3), ty.at(3));
    return {
        *std::min_element(tx.begin(), tx.end()),
        *std::min_element(ty.begin(), ty.end()),
        *std::max_element(tx.begin(), tx.end()),
        *std::max_element(ty.begin(), ty.end())};
}